

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_values.cpp
# Opt level: O3

ON_wString
ON_NTimesPowerOf10AsString
          (double value,double tol,ON_wString *g_format,ON__UINT64 n,int e,double *clean_value)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  bool bVar3;
  int ie;
  int iVar4;
  undefined4 extraout_var;
  ON_wString extraout_RAX;
  ON_wString OVar5;
  wchar_t *extraout_RAX_00;
  ulong uVar6;
  undefined4 in_register_00000014;
  ulong uVar7;
  uint uVar8;
  double *in_R8;
  ulong uVar9;
  ulong uVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  double y;
  wchar_t sf [32];
  uint local_a8 [32];
  
  uVar7 = CONCAT44(in_register_00000014,e);
  uVar10 = (ulong)clean_value & 0xffffffff;
  if (in_R8 != (double *)0x0) {
    *in_R8 = value;
  }
  bVar3 = ON_IsValid(value);
  if (((bVar3) && (ABS(value) < 1e+18)) && (1e-18 < ABS(value))) {
    uVar8 = (uint)clean_value;
    if ((int)uVar8 < 0) {
      iVar4 = 0;
      uVar6 = 1;
      do {
        uVar6 = uVar6 * 10;
        iVar4 = iVar4 + -1;
      } while ((int)uVar8 < iVar4);
      auVar13._8_4_ = in_register_00000014;
      auVar13._0_8_ = uVar7;
      auVar13._12_4_ = 0x45300000;
      auVar17._8_4_ = (int)(uVar6 >> 0x20);
      auVar17._0_8_ = uVar6;
      auVar17._12_4_ = 0x45300000;
      dVar11 = (auVar17._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar6) - 4503599627370496.0);
      if ((auVar13._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,e) - 4503599627370496.0) <= dVar11 * 1e-18)
      goto LAB_005c2a37;
      uVar10 = uVar7 / uVar6;
      uVar7 = uVar7 % uVar6;
    }
    else {
      uVar6 = 1;
      while (uVar8 != 0) {
        uVar6 = uVar6 * 10;
        uVar8 = (int)uVar10 - 1;
        uVar10 = (ulong)uVar8;
      }
      auVar12._8_4_ = in_register_00000014;
      auVar12._0_8_ = uVar7;
      auVar12._12_4_ = 0x45300000;
      auVar16._8_4_ = (int)(uVar6 >> 0x20);
      auVar16._0_8_ = uVar6;
      auVar16._12_4_ = 0x45300000;
      dVar11 = (auVar16._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar6) - 4503599627370496.0);
      if (1e+18 <= ((auVar12._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,e) - 4503599627370496.0)) * dVar11)
      goto LAB_005c2a37;
      uVar10 = uVar7 * uVar6;
      uVar7 = 0;
    }
    auVar15._8_4_ = (int)(uVar10 >> 0x20);
    auVar15._0_8_ = uVar10;
    auVar15._12_4_ = 0x45300000;
    auVar18._8_4_ = (int)(uVar7 >> 0x20);
    auVar18._0_8_ = uVar7;
    auVar18._12_4_ = 0x45300000;
    dVar11 = ((auVar18._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar7) - 4503599627370496.0)) / dVar11 +
             (auVar15._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar10) - 4503599627370496.0);
    if (ABS(dVar11 - value) <= tol) {
      if (uVar7 == 0) {
        if (in_R8 != (double *)0x0) {
          *in_R8 = dVar11;
        }
        OVar5 = ON_wString::FormatToString((wchar_t *)g_format,L"%llu",uVar10);
        return (ON_wString)OVar5.m_s;
      }
      local_a8[0x1c] = 0;
      local_a8[0x1d] = 0;
      local_a8[0x1e] = 0;
      local_a8[0x1f] = 0;
      local_a8[0x18] = 0;
      local_a8[0x19] = 0;
      local_a8[0x1a] = 0;
      local_a8[0x1b] = 0;
      local_a8[0x14] = 0;
      local_a8[0x15] = 0;
      local_a8[0x16] = 0;
      local_a8[0x17] = 0;
      local_a8[0x10] = 0;
      local_a8[0x11] = 0;
      local_a8[0x12] = 0;
      local_a8[0x13] = 0;
      local_a8[0xc] = 0;
      local_a8[0xd] = 0;
      local_a8[0xe] = 0;
      local_a8[0xf] = 0;
      local_a8[8] = 0;
      local_a8[9] = 0;
      local_a8[10] = 0;
      local_a8[0xb] = 0;
      local_a8[4] = 0;
      local_a8[5] = 0;
      local_a8[6] = 0;
      local_a8[7] = 0;
      local_a8[0] = 0;
      local_a8[1] = 0;
      local_a8[2] = 0;
      local_a8[3] = 0;
      if (9 < uVar6) {
        uVar9 = 0;
        do {
          auVar1._8_8_ = 0;
          auVar1._0_8_ = uVar6 / 10;
          auVar2._8_8_ = 0;
          auVar2._0_8_ = uVar7;
          local_a8[uVar9] =
               SUB164(auVar2 / auVar1,0) + (int)(SUB168(auVar2 / auVar1,0) / 10) * -10 | 0x30;
          if (uVar6 < 100) break;
          bVar3 = uVar9 < 0x1f;
          uVar6 = uVar6 / 10;
          uVar9 = uVar9 + 1;
        } while (bVar3);
      }
      ON_wString::FormatToString((wchar_t *)g_format,L"%llu.%ls",uVar10,local_a8);
      dVar11 = ON_DBL_QNAN;
      iVar4 = ON_wString::Scan(g_format,L"%lf");
      if (iVar4 == 1) {
        dVar14 = ABS(dVar11 - value);
        if ((in_R8 != (double *)0x0) && (dVar14 <= tol)) {
          *in_R8 = dVar11;
          return (ON_wString)(wchar_t *)CONCAT44(extraout_var,iVar4);
        }
        if (dVar14 <= tol) {
          return (ON_wString)(wchar_t *)CONCAT44(extraout_var,iVar4);
        }
      }
      ON_wString::~ON_wString(g_format);
    }
    ON_wString::ON_wString(g_format,(ON_wString *)n);
    return (ON_wString)extraout_RAX_00;
  }
LAB_005c2a37:
  ON_wString::ON_wString(g_format,(ON_wString *)n);
  return (ON_wString)extraout_RAX.m_s;
}

Assistant:

static
const ON_wString ON_NTimesPowerOf10AsString(
  double value,
  double tol,
  const ON_wString& g_format,
  ON__UINT64 n,
  int e,
  double* clean_value
)
{
  if (nullptr != clean_value)
    *clean_value = value;

  if ( false == ON_IsValid(value) )
    return ON_NTimesPowerOf10AsStringFail(g_format,false); // value is a nan or UNSET value.

  // ON__UINT64 range is 0 to 18,446,744,073,709,551,615 = 1.8...e19
  const double max_pretty_value = 1.0e18; // must be <= 18,446,744,073,709,551,615 ( 20 decimal digits )
  const double min_pretty_value = 1.0 / max_pretty_value;
  if (fabs(value) >= max_pretty_value || fabs(value) <= min_pretty_value)
    return ON_NTimesPowerOf10AsStringFail(g_format,false); // value is too big or too small for a "pretty" format.
  

  // returns n*(10^e) as a "pretty" string - no exponential notation that disturbs users.
  ON__UINT64 q = 1;
  ON__UINT64 i = 0;
  ON__UINT64 f = 0;

  if (e >= 0)
  {
    for (int ie = 0; ie < e; ie++)
      q *= 10;

    if (fabs((double)n)*fabs((double)q) >= max_pretty_value)
      return ON_NTimesPowerOf10AsStringFail(g_format,false);

    i = n*q;
    f = 0;
  }
  else
  {
    // e is negative
    for (int ie = 0; ie > e; ie--)
      q *= 10;
    if (fabs((double)n) <= min_pretty_value*fabs((double)q))
      return ON_NTimesPowerOf10AsStringFail(g_format,false);

    i = n / q;
    f = n % q;
  }

  const double x = ((double)i) + ((double)f) / ((double)q);
  if (fabs(x - value) <= tol)
  {
    if (0 == f)
    {
      if (nullptr != clean_value)
        *clean_value = x;
      return ON_wString::FormatToString(L"%llu", i);
    }
    wchar_t sf[32] = { 0 }; // 32 is more than enough to hold the maximum of 20 digits
    size_t sf_capacity = sizeof(sf) / sizeof(sf[i]);
    size_t sfi = 0;
    for (ON__UINT64 r = q / 10; r > 0 && sfi < sf_capacity; r /= 10)
    {
      sf[sfi++] = (wchar_t)(int((f / r)%10) + '0');
    }
    const ON_wString value_as_string = ON_wString::FormatToString(L"%llu.%ls", i, sf);
    double y = ON_DBL_QNAN;
    const int scan_count = value_as_string.Scan( L"%lf", &y );
    if (1 == scan_count && fabs(y - value) <= tol)
    {
      if (nullptr != clean_value)
        *clean_value = y;
      return value_as_string;
    }
  }

  return ON_NTimesPowerOf10AsStringFail(g_format,false);
}